

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic_enum_containers.hpp
# Opt level: O0

pair<magic_enum::containers::detail::FilteredIterator<const_magic_enum::containers::set<Color,_std::less<Color>_>_*,_const_Color_*,_magic_enum::containers::set<Color,_std::less<Color>_>::Getter,_magic_enum::containers::set<Color,_std::less<Color>_>::Predicate>,_bool>
* __thiscall
magic_enum::containers::set<Color,_std::less<Color>_>::insert
          (pair<magic_enum::containers::detail::FilteredIterator<const_magic_enum::containers::set<Color,_std::less<Color>_>_*,_const_Color_*,_magic_enum::containers::set<Color,_std::less<Color>_>::Getter,_magic_enum::containers::set<Color,_std::less<Color>_>::Predicate>,_bool>
           *__return_storage_ptr__,set<Color,_std::less<Color>_> *this,value_type *value)

{
  bool bVar1;
  Color *pCVar2;
  Color *pCVar3;
  unsigned_long *puVar4;
  Color *pCVar5;
  optional<unsigned_long> oVar6;
  bool local_a1;
  const_iterator local_a0;
  FilteredIterator<const_magic_enum::containers::set<Color,_std::less<Color>_>_*,_const_Color_*,_magic_enum::containers::set<Color,_std::less<Color>_>::Getter,_magic_enum::containers::set<Color,_std::less<Color>_>::Predicate>
  local_70;
  bool local_41;
  undefined1 local_40 [7];
  bool r;
  reference ref;
  optional<unsigned_long> i;
  value_type *value_local;
  set<Color,_std::less<Color>_> *this_local;
  
  oVar6 = detail::indexing<Color,_std::less<Color>,_void>::at(*value);
  ref._16_8_ = oVar6.super__Optional_base<unsigned_long,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_long>._M_payload;
  bVar1 = std::optional::operator_cast_to_bool((optional *)&ref.bit_index);
  if (bVar1) {
    bitset<Color,_magic_enum::containers::detail::indexing<Color,_std::less<Color>,_void>_>::
    operator[]((reference *)local_40,&this->a,*value);
    bVar1 = bitset::reference_impl::operator_cast_to_bool((reference_impl *)local_40);
    local_41 = (bool)((bVar1 ^ 0xffU) & 1);
    if (local_41 != false) {
      bitset<Color,_magic_enum::containers::detail::indexing<Color,_std::less<Color>,_void>_>::
      reference_impl<magic_enum::containers::bitset<Color,_magic_enum::containers::detail::indexing<Color,_std::less<Color>,_void>_>_*>
      ::operator=((reference_impl<magic_enum::containers::bitset<Color,_magic_enum::containers::detail::indexing<Color,_std::less<Color>,_void>_>_*>
                   *)local_40,true);
      this->s = this->s + 1;
    }
    pCVar2 = detail::indexing<Color,_std::less<Color>,_void>::begin();
    pCVar3 = detail::indexing<Color,_std::less<Color>,_void>::end();
    puVar4 = Catch::clara::std::optional<unsigned_long>::operator*
                       ((optional<unsigned_long> *)&ref.bit_index);
    pCVar5 = detail::indexing<Color,_std::less<Color>,_void>::it(*puVar4);
    detail::
    FilteredIterator<const_magic_enum::containers::set<Color,_std::less<Color>_>_*,_const_Color_*,_magic_enum::containers::set<Color,_std::less<Color>_>::Getter,_magic_enum::containers::set<Color,_std::less<Color>_>::Predicate>
    ::FilteredIterator(&local_70,this,pCVar2,pCVar3,pCVar5);
    Catch::clara::std::
    pair<magic_enum::containers::detail::FilteredIterator<const_magic_enum::containers::set<Color,_std::less<Color>_>_*,_const_Color_*,_magic_enum::containers::set<Color,_std::less<Color>_>::Getter,_magic_enum::containers::set<Color,_std::less<Color>_>::Predicate>,_bool>
    ::
    pair<magic_enum::containers::detail::FilteredIterator<const_magic_enum::containers::set<Color,_std::less<Color>_>_*,_const_Color_*,_magic_enum::containers::set<Color,_std::less<Color>_>::Getter,_magic_enum::containers::set<Color,_std::less<Color>_>::Predicate>,_bool_&,_true>
              (__return_storage_ptr__,&local_70,&local_41);
  }
  else {
    end(&local_a0,this);
    local_a1 = false;
    Catch::clara::std::
    pair<magic_enum::containers::detail::FilteredIterator<const_magic_enum::containers::set<Color,_std::less<Color>_>_*,_const_Color_*,_magic_enum::containers::set<Color,_std::less<Color>_>::Getter,_magic_enum::containers::set<Color,_std::less<Color>_>::Predicate>,_bool>
    ::
    pair<magic_enum::containers::detail::FilteredIterator<const_magic_enum::containers::set<Color,_std::less<Color>_>_*,_const_Color_*,_magic_enum::containers::set<Color,_std::less<Color>_>::Getter,_magic_enum::containers::set<Color,_std::less<Color>_>::Predicate>,_bool,_true>
              (__return_storage_ptr__,&local_a0,&local_a1);
  }
  return __return_storage_ptr__;
}

Assistant:

constexpr std::pair<iterator, bool> insert(const value_type& value) noexcept {
    if (auto i = index_type::at(value)) {
      typename container_type::reference ref = a[value];
      bool r = !ref;
      if (r) {
        ref = true;
        ++s;
      }

      return {iterator{this, index_type::begin(), index_type::end(), index_type::it(*i)}, r};
    }
    return {end(), false};
  }